

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HJNN.cpp
# Opt level: O3

void __thiscall HJNN::backward(HJNN *this)

{
  ofstream *this_00;
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  undefined1 *puVar4;
  pointer pLVar5;
  double *pdVar6;
  double *pdVar7;
  VectorXd *pVVar8;
  pointer pMVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  pointer this_01;
  undefined8 uVar13;
  ostream *poVar14;
  ostream *poVar15;
  ostream *poVar16;
  Index index;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  uint uVar20;
  pointer pMVar21;
  Index index_1;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  double dVar25;
  ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  temp;
  assign_op<double,_double> local_b9;
  ostream *local_b8;
  pointer local_b0;
  undefined1 local_a8 [56];
  pointer local_70;
  VectorXd *pVStack_68;
  long local_60;
  double local_58;
  VectorXd *local_50;
  void *local_40;
  double *local_38;
  
  if ((this->truthMinusOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows < 0) {
    pcVar18 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
    ;
LAB_0010adf2:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,pcVar18);
  }
  local_b0 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = (ostream *)
             (double)local_b0[-1].out.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows;
  Layer::derivative((Layer *)local_a8);
  uVar13 = local_a8._0_8_;
  puVar4 = (undefined1 *)
           (this->truthMinusOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (puVar4 != (undefined1 *)local_a8._8_8_) {
    pcVar18 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
    ;
LAB_0010ae28:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x6e,pcVar18);
  }
  pLVar5 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar6 = (this->truthMinusOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  if ((undefined1 *)
      pLVar5[-1].backwardAccumulation.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_storage.m_rows != puVar4) {
    if ((long)puVar4 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&pLVar5[-1].backwardAccumulation,(Index)puVar4,
               (Index)puVar4,1);
    if ((undefined1 *)
        pLVar5[-1].backwardAccumulation.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != puVar4) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2d1,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
                   );
    }
  }
  dVar25 = -2.0 / (double)local_b8;
  pdVar7 = pLVar5[-1].backwardAccumulation.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar17 = (long)puVar4 - ((long)puVar4 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)puVar4) {
    lVar19 = 0;
    do {
      pdVar2 = pdVar6 + lVar19;
      dVar11 = pdVar2[1];
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar13)->m_storage)
                 .m_data + lVar19;
      dVar12 = (double)ppdVar3[1];
      pdVar1 = pdVar7 + lVar19;
      *pdVar1 = *pdVar2 * dVar25 * (double)*ppdVar3;
      pdVar1[1] = dVar11 * dVar25 * dVar12;
      lVar19 = lVar19 + 2;
    } while (lVar19 < (long)uVar17);
  }
  if ((long)uVar17 < (long)puVar4) {
    do {
      pdVar7[uVar17] =
           pdVar6[uVar17] * dVar25 *
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar13)->
                     m_storage).m_data)[uVar17];
      uVar17 = uVar17 + 1;
    } while (puVar4 != (undefined1 *)uVar17);
  }
  free((void *)local_a8._0_8_);
  if (this->debug == true) {
    pLVar5 = local_b0 + -1;
    this_00 = &this->log;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"------round",0xb);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->rounddebug);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," start---------\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"[last layer]\ntruth=",0x13);
    poVar14 = Eigen::operator<<((ostream *)this_00,
                                (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->truth);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", output=",9);
    poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                        &pLVar5->out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", last layer accum=",0x13);
    poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                        &(this->layers).
                                         super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                         super__Vector_impl_data._M_finish[-1].backwardAccumulation)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  iVar10 = (int)((ulong)((long)(this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < iVar10 + -2) {
    local_b8 = (ostream *)&this->log;
    uVar17 = (ulong)(iVar10 - 1);
    do {
      uVar20 = (int)uVar17 - 1;
      uVar17 = (ulong)uVar20;
      pLVar5 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar21 = (this->weights).
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar21[uVar17].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows !=
          *(Index *)((long)&pLVar5[uVar17 + 1].backwardAccumulation.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8)) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/Product.h"
                      ,0x61,
                      "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_70 = pMVar21 + uVar17;
      pVStack_68 = &pLVar5[uVar17 + 1].backwardAccumulation;
      Layer::derivative((Layer *)&local_40);
      local_a8._0_8_ = local_70;
      local_a8._8_8_ = pVStack_68;
      local_a8._16_8_ = (Layer *)&local_40;
      if ((double *)
          (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols != local_38) {
        pcVar18 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_0010ae28;
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::internal::assign_op<double,double>>
                (&(this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar17].backwardAccumulation,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_a8,&local_b9);
      free(local_40);
      poVar14 = local_b8;
      if (this->debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_b8,"[layer",6);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,uVar20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] data\n",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"accum from last layer=\n",0x17);
        poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                                             *)&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\nlayer ",7);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,uVar20);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"deri=\n",6);
        Layer::derivative((Layer *)local_a8);
        poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                            local_a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
        free((void *)local_a8._0_8_);
      }
    } while (1 < (int)uVar20);
  }
  if (this->debug != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[delta weight and bias]\n",0x18);
  }
  pMVar21 = (this->weights).
            super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->weights).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar21) {
    local_b0 = (pointer)&this->log;
    poVar14 = (ostream *)0x0;
    do {
      poVar16 = poVar14 + 1;
      pLVar5 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar8 = *(VectorXd **)
                ((long)&pLVar5[(long)poVar16].backwardAccumulation.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8);
      local_b8 = poVar16;
      if ((long)pVVar8 < 0) goto LAB_0010addd;
      local_a8._32_8_ = &pLVar5[(long)poVar16].backwardAccumulation;
      local_a8._24_8_ = this->learningRate;
      local_a8._48_8_ = &pLVar5[(long)poVar14].out;
      local_a8._8_8_ = pVVar8;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_70,
                 (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                  *)local_a8);
      puVar4 = (undefined1 *)
               pMVar21[(long)poVar14].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      if ((VectorXd *)puVar4 != pVStack_68) {
LAB_0010adfc:
        pcVar18 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, -1, -1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
LAB_0010ae66:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2c6,pcVar18);
      }
      lVar19 = pMVar21[(long)poVar14].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      if (lVar19 != local_60) goto LAB_0010adfc;
      pdVar6 = pMVar21[(long)poVar14].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar19 = lVar19 * (long)puVar4;
      uVar17 = lVar19 - (lVar19 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar19) {
        lVar23 = 0;
        do {
          dVar25 = (pdVar6 + lVar23)[1];
          ppdVar3 = &(local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + lVar23;
          dVar11 = (double)ppdVar3[1];
          pdVar6[lVar23] = pdVar6[lVar23] - (double)*ppdVar3;
          (pdVar6 + lVar23)[1] = dVar25 - dVar11;
          lVar23 = lVar23 + 2;
        } while (lVar23 < (long)uVar17);
      }
      if ((long)uVar17 < lVar19) {
        do {
          pdVar6[uVar17] =
               pdVar6[uVar17] -
               (double)(&(local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         ).m_storage.m_data)[uVar17];
          uVar17 = uVar17 + 1;
        } while (lVar19 - uVar17 != 0);
      }
      free(local_70);
      this_01 = local_b0;
      pLVar5 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = *(Index *)((long)&pLVar5[(long)poVar16].backwardAccumulation.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8)
      ;
      if ((long)uVar17 < 0) goto LAB_0010addd;
      pMVar9 = (this->biases).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar9[(long)poVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows != uVar17) {
        pcVar18 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
        goto LAB_0010ae66;
      }
      dVar25 = this->learningRate;
      lVar19 = *(long *)&pLVar5[(long)poVar16].backwardAccumulation.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      lVar23 = (long)pMVar9[(long)poVar14].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      uVar22 = uVar17 & 0x7ffffffffffffffe;
      if (1 < uVar17) {
        uVar24 = 0;
        do {
          pdVar6 = (double *)(lVar19 + uVar24 * 8);
          dVar11 = pdVar6[1];
          pdVar7 = (double *)(lVar23 + uVar24 * 8);
          dVar12 = pdVar7[1];
          pdVar1 = (double *)(lVar23 + uVar24 * 8);
          *pdVar1 = *pdVar7 - *pdVar6 * dVar25;
          pdVar1[1] = dVar12 - dVar11 * dVar25;
          uVar24 = uVar24 + 2;
        } while (uVar24 < uVar22);
      }
      for (; uVar22 != uVar17; uVar22 = uVar22 + 1) {
        *(double *)(lVar23 + uVar22 * 8) =
             *(double *)(lVar23 + uVar22 * 8) - *(double *)(lVar19 + uVar22 * 8) * dVar25;
      }
      if (this->debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,"delta weight",0xc);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)this_01,(int)poVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"=\n",2);
        pLVar5 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar8 = *(VectorXd **)
                  ((long)&pLVar5[(long)poVar16].backwardAccumulation.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8);
        if (-1 < (long)pVVar8) {
          local_a8._32_8_ = &pLVar5[(long)poVar16].backwardAccumulation;
          local_a8._24_8_ = this->learningRate;
          local_a8._48_8_ = &pLVar5[(long)poVar14].out;
          local_a8._8_8_ = pVVar8;
          poVar15 = Eigen::operator<<(poVar15,(DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                                               *)local_a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\ndelta bias",0xb);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar15,(int)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"=\n",2);
          pLVar5 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pVVar8 = *(VectorXd **)
                    ((long)&pLVar5[(long)poVar16].backwardAccumulation.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8);
          if (-1 < (long)pVVar8) {
            local_50 = &pLVar5[(long)poVar16].backwardAccumulation;
            local_58 = this->learningRate;
            pVStack_68 = pVVar8;
            poVar14 = Eigen::operator<<(poVar14,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                 *)&local_70);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            goto LAB_0010ad30;
          }
        }
LAB_0010addd:
        pcVar18 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_0010adf2;
      }
LAB_0010ad30:
      pMVar21 = (this->weights).
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar16 = (ostream *)
                (((long)(this->weights).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar21 >> 3) *
                -0x5555555555555555);
      poVar14 = local_b8;
    } while (local_b8 <= poVar16 && (long)poVar16 - (long)local_b8 != 0);
  }
  if (this->debug != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->log,"------round",0xb);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&this->log,this->rounddebug);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," end---------",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  return;
}

Assistant:

void HJNN::train(Eigen::MatrixXd data,Eigen::MatrixXd truths,double threshold,int maxRounds,double _learningRate){
	if(data.rows()!=layers[0].neuronNum){
		std::cerr<<"data dimension does not match the input neuron number of network! "<<std::endl;
		return;
	}
	lastLoss=0;
	lossIncreaseTime=0;
	if(debug){
		auto t = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
		std::stringstream ss;
		ss << std::put_time(std::localtime(&t), "%F %T");
		std::string str = "log_"+ss.str()+".txt";
		log.open(str);
	}

	int dataNum=data.cols();
	int rounds=0;
	learningRate=_learningRate;
	double loss=0;
	Eigen::ArrayXd lossList=Eigen::ArrayXd::Zero(dataNum);
	while(rounds<maxRounds){
		int index=rounds++%dataNum;
		rounddebug=rounds;
		//set input and truth
		layers[0].out=data.col(index);
		truth=truths.col(index);
		//do a round
		forward();
		loss=lossList(index)=calculateLoss();
		std::cout<<"round "<<rounds<<",loss "<<loss<<std::endl;
		if(loss>lastLoss&&loss>threshold){
			if(++lossIncreaseTime>10){
				std::cerr<<"loss continue increase, net probably will not converge, stop training!"<<std::endl;
				break;
			}
		}else lossIncreaseTime=0;
		lastLoss=loss;
		if(loss>1e100){
			std::cerr<<"loss is too large, net probably will not converge, stop training!"<<std::endl;
			break;
		}
//		if(loss>threshold)backward();
		backward();
		//if average loss is less than threshold then terminate training
//		if(index>=dataNum-1){
//			double avgLoss=lossList.sum()/dataNum<threshold;
//			if(avgLoss<threshold)break;
//			if(index==dataNum-1)std::cout<<"one iteration completed, average loss="<<avgLoss<<std::endl;
//		}
	}
	std::cout<<"Training completed! "<<rounds<<" rounds trained, average loss="<<lossList.sum()/dataNum<<std::endl;
	if(debug)log.close();
}